

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

float duy(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  beaudet_t *pbVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  beaudet_t *pbVar7;
  int iVar8;
  float fVar9;
  
  iVar1 = Ix.m / 2;
  iVar3 = iVar1 * 3 + p->ofst;
  fVar9 = 0.0;
  if ((((iVar3 <= y) && (iVar3 <= x)) && (x < p->sizy - iVar3)) && (y < p->sizx - iVar3)) {
    iVar4 = -iVar1;
    lVar5 = (long)iVar4;
    iVar3 = iVar1 + 1;
    if (iVar1 + 1 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = x - iVar1;
    fVar9 = 0.0;
    pbVar2 = &Ix;
    for (; lVar6 = (long)iVar1 * 2 + 1, pbVar7 = pbVar2, iVar8 = y - iVar1, lVar5 != iVar3;
        lVar5 = lVar5 + 1) {
      while (lVar6 != 0) {
        fVar9 = fVar9 + (*p->flow_ptr)[p->res * iVar4 + iVar8].x * pbVar7->g[0][0];
        lVar6 = lVar6 + -1;
        pbVar7 = (beaudet_t *)(pbVar7->g + 1);
        iVar8 = iVar8 + 1;
      }
      iVar4 = iVar4 + 1;
      pbVar2 = (beaudet_t *)(pbVar2->g[0] + 1);
    }
  }
  return fVar9 / Ix.f;
}

Assistant:

float duy(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].x*Ix.g[j+h][i+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}